

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fl_Text_Buffer.cxx
# Opt level: O1

int __thiscall
Fl_Text_Buffer::search_backward
          (Fl_Text_Buffer *this,int startPos,char *searchString,int *foundPos,int matchCase)

{
  int iVar1;
  int iVar2;
  uint ucs;
  uint ucs_00;
  long lVar3;
  char *__s2;
  char *pcVar4;
  size_t __n;
  int iVar5;
  int l;
  wchar_t local_3c;
  int *local_38;
  
  if (searchString != (char *)0x0) {
    local_38 = foundPos;
    if (matchCase == 0) {
      pcVar4 = searchString;
      iVar5 = startPos;
      if (-1 < startPos) {
        do {
          while( true ) {
            if (*pcVar4 == '\0') {
              *local_38 = iVar5;
              return 1;
            }
            ucs = char_at(this,startPos);
            ucs_00 = fl_utf8decode(pcVar4,(char *)0x0,&local_3c);
            iVar2 = fl_tolower(ucs);
            iVar1 = fl_tolower(ucs_00);
            if (iVar2 != iVar1) break;
            lVar3 = (long)local_3c;
            startPos = next_char(this,startPos);
            pcVar4 = pcVar4 + lVar3;
          }
          if (iVar5 == 0) {
            startPos = -1;
          }
          else {
            startPos = prev_char_clipped(this,iVar5);
          }
          pcVar4 = searchString;
          iVar5 = startPos;
        } while (-1 < startPos);
      }
    }
    else {
      pcVar4 = searchString;
      iVar5 = startPos;
      if (-1 < startPos) {
        do {
          do {
            if (*pcVar4 == '\0') {
              *local_38 = iVar5;
              iVar2 = 1;
            }
            else {
              iVar1 = fl_utf8len1(*pcVar4);
              __s2 = this->mBuf + startPos + ((long)this->mGapEnd - (long)this->mGapStart);
              if (startPos < this->mGapStart) {
                __s2 = this->mBuf + startPos;
              }
              __n = (size_t)iVar1;
              iVar2 = bcmp(pcVar4,__s2,__n);
              if (iVar2 != 0) {
                iVar1 = 0;
                __n = 0;
              }
              pcVar4 = pcVar4 + __n;
              iVar2 = (uint)(iVar2 != 0) << 2;
              startPos = iVar1 + startPos;
            }
          } while (iVar2 == 0);
          if (iVar2 != 4) {
            return 1;
          }
          if (iVar5 == 0) {
            startPos = -1;
          }
          else {
            startPos = prev_char_clipped(this,iVar5);
          }
          pcVar4 = searchString;
          iVar5 = startPos;
        } while (-1 < startPos);
      }
    }
  }
  return 0;
}

Assistant:

int Fl_Text_Buffer::search_backward(int startPos, const char *searchString,
				    int *foundPos, int matchCase) const 
{
  IS_UTF8_ALIGNED2(this, (startPos))
  IS_UTF8_ALIGNED(searchString)
  
  if (!searchString)
    return 0;
  int bp;
  const char *sp;
  if (matchCase) {
    while (startPos >= 0) {
      bp = startPos;
      sp = searchString;
      for (;;) {
        char c = *sp;
        // we reached the end of the "needle", so we found the string!
        if (!c) {
          *foundPos = startPos;
          return 1;
        }
        int l = fl_utf8len1(c);
        if (memcmp(sp, address(bp), l))
          break;
        sp += l; bp += l;
      }
      startPos = prev_char(startPos);
    }
  } else {
    while (startPos >= 0) {
      bp = startPos;
      sp = searchString;
      for (;;) {
        // we reached the end of the "needle", so we found the string!
        if (!*sp) {
          *foundPos = startPos;
          return 1;
        }
        int l;
        unsigned int b = char_at(bp);
        unsigned int s = fl_utf8decode(sp, 0, &l);
        if (fl_tolower(b)!=fl_tolower(s))
          break;
        sp += l; 
        bp = next_char(bp);
      }
      startPos = prev_char(startPos);
    }
  }  
  return 0;
}